

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void add_history(CHAR_DATA *ch,CHAR_DATA *victim,char *string)

{
  char *str;
  size_t sVar1;
  char *pcVar2;
  char buf [4608];
  char obuf [4608];
  char local_2428 [4608];
  char local_1228 [4608];
  
  str = ctime(&current_time);
  chomp(str);
  pcVar2 = victim->pcdata->history_buffer;
  if (pcVar2 == (char *)0x0) {
    local_2428[0] = '\0';
  }
  else {
    strcpy(local_2428,pcVar2);
  }
  if (ch == (CHAR_DATA *)0x0) {
    pcVar2 = "AUTO";
  }
  else {
    pcVar2 = ch->name;
  }
  sprintf(local_1228,"Added by %s (%s at %d hours)\n\r",pcVar2,str,
          ((victim->played + current_time) - victim->logon) / 0xe10 & 0xffffffff);
  strcat(local_2428,local_1228);
  strcat(local_2428,string);
  sVar1 = strlen(local_2428);
  (local_2428 + sVar1)[0] = '\n';
  (local_2428 + sVar1)[1] = '\r';
  local_2428[sVar1 + 2] = '\0';
  free_pstring(victim->pcdata->history_buffer);
  pcVar2 = palloc_string(local_2428);
  victim->pcdata->history_buffer = pcVar2;
  return;
}

Assistant:

void add_history(CHAR_DATA *ch, CHAR_DATA *victim, char *string)
{
	char buf[MAX_STRING_LENGTH];
	char obuf[MAX_STRING_LENGTH];
	char *strtime;

	strtime = ctime(&current_time);
	chomp(strtime);

	if (victim->pcdata->history_buffer)
		sprintf(buf, "%s", victim->pcdata->history_buffer);
	else
		strcpy(buf, "");

	sprintf(obuf, "Added by %s (%s at %d hours)\n\r",
		ch ? ch->name : "AUTO",
		strtime,
		(int)((victim->played + current_time - victim->logon) / 3600));

	strcat(buf, obuf);
	strcat(buf, string);
	strcat(buf, "\n\r");

	free_pstring(victim->pcdata->history_buffer);
	victim->pcdata->history_buffer = palloc_string(buf);
}